

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void vmaDestroyBuffer(VmaAllocator allocator,VkBuffer buffer,VmaAllocation allocation)

{
  PFN_vkDestroyBuffer p_Var1;
  VkDevice pVVar2;
  VmaVulkanFunctions *pVVar3;
  VkAllocationCallbacks *pVVar4;
  long in_RDX;
  VkBuffer in_RSI;
  VmaAllocator_T *in_RDI;
  VmaAllocation *unaff_retaddr;
  size_t in_stack_00000008;
  VmaAllocator_T *in_stack_00000010;
  
  if ((in_RSI != (VkBuffer)0x0) || (in_RDX != 0)) {
    if (in_RSI != (VkBuffer)0x0) {
      pVVar3 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
      p_Var1 = pVVar3->vkDestroyBuffer;
      pVVar2 = in_RDI->m_hDevice;
      pVVar4 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
      (*p_Var1)(pVVar2,in_RSI,pVVar4);
    }
    if (in_RDX != 0) {
      VmaAllocator_T::FreeMemory(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyBuffer(
    VmaAllocator allocator,
    VkBuffer buffer,
    VmaAllocation allocation)
{
    VMA_ASSERT(allocator);

    if(buffer == VK_NULL_HANDLE && allocation == VK_NULL_HANDLE)
    {
        return;
    }

    VMA_DEBUG_LOG("vmaDestroyBuffer");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    if(buffer != VK_NULL_HANDLE)
    {
        (*allocator->GetVulkanFunctions().vkDestroyBuffer)(allocator->m_hDevice, buffer, allocator->GetAllocationCallbacks());
    }

    if(allocation != VK_NULL_HANDLE)
    {
        allocator->FreeMemory(
            1, // allocationCount
            &allocation);
    }
}